

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O1

bool Datetime::valid(int y,int d)

{
  int iVar1;
  
  if (d < 1 || y < 0) {
    return false;
  }
  if (((y & 3U) != 0) || (iVar1 = 0x16e, y == ((uint)y / 100) * 100)) {
    iVar1 = (((uint)(y * -0x3d70a3d7) >> 4 | y * -0x70000000) < 0xa3d70b) + 0x16d;
  }
  return d <= iVar1;
}

Assistant:

bool Datetime::valid (const int y, const int d)
{
  // Check that the year is valid.
  if (y < 0)
    return false;

  if (d < 1 || d > Datetime::daysInYear (y))
    return false;

  return true;
}